

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::MacroExpansion::append
          (MacroExpansion *this,Token token,SourceLocation location,bool allowLineContinuation)

{
  BumpAllocator *pBVar1;
  SmallVectorBase<slang::parsing::Token> *pSVar2;
  string_view rawText;
  int iVar3;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  Token TVar4;
  Token local_1b0;
  SourceLocation local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  span<slang::parsing::Trivia,_18446744073709551615UL> local_188;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_178;
  Token local_168;
  string_view local_158;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  Trivia local_134;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_118;
  undefined1 local_108 [8];
  SmallVector<slang::parsing::Trivia,_8UL> newTrivia;
  SourceLocation local_60;
  SourceLocation local_40;
  bool allowLineContinuation_local;
  MacroExpansion *this_local;
  SourceLocation location_local;
  Token token_local;
  
  location_local = token._0_8_;
  if ((this->any & 1U) == 0) {
    if ((this->isTopLevel & 1U) == 0) {
      pBVar1 = this->alloc;
      trivia = Token::trivia(&this->usageSite);
      TVar4 = Token::withTrivia((Token *)&location_local,pBVar1,trivia);
      local_40 = TVar4._0_8_;
      location_local = local_40;
    }
    else {
      pBVar1 = this->alloc;
      nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span<true,_0>
                ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
                 (newTrivia.stackBase + 0x68));
      TVar4 = Token::withTrivia((Token *)&location_local,pBVar1,stack0xffffffffffffff90);
      local_60 = TVar4._0_8_;
      location_local = local_60;
    }
    this->any = true;
  }
  if ((location_local._0_2_ != 0x15f) || (allowLineContinuation)) {
    pSVar2 = this->dest;
    local_1b0 = Token::withLocation((Token *)&location_local,this->alloc,location);
    SmallVectorBase<slang::parsing::Token>::push_back(pSVar2,&local_1b0);
  }
  else {
    SmallVector<slang::parsing::Trivia,_8UL>::SmallVector
              ((SmallVector<slang::parsing::Trivia,_8UL> *)local_108);
    local_118 = Token::trivia((Token *)&location_local);
    SmallVectorBase<slang::parsing::Trivia>::
    append<nonstd::span_lite::span<slang::parsing::Trivia_const,18446744073709551615ul>>
              ((SmallVectorBase<slang::parsing::Trivia> *)local_108,&local_118);
    local_158 = Token::rawText((Token *)&location_local);
    local_148 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&local_158,1,0xffffffffffffffff);
    Trivia::Trivia(&local_134,EndOfLine,local_148);
    SmallVectorBase<slang::parsing::Trivia>::push_back
              ((SmallVectorBase<slang::parsing::Trivia> *)local_108,&local_134);
    pBVar1 = this->alloc;
    pSVar2 = this->dest;
    iVar3 = SmallVectorBase<slang::parsing::Trivia>::copy
                      ((SmallVectorBase<slang::parsing::Trivia> *)local_108,(EVP_PKEY_CTX *)pBVar1,
                       src);
    local_188.data_ = (pointer)CONCAT44(extraout_var,iVar3);
    nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
    span<slang::parsing::Trivia,_18446744073709551615UL,_0>(&local_178,&local_188);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_198,"");
    rawText._M_str = local_198._M_str;
    rawText._M_len = local_198._M_len;
    local_1a0 = location;
    Token::Token(&local_168,pBVar1,EmptyMacroArgument,local_178,rawText,location);
    SmallVectorBase<slang::parsing::Token>::push_back(pSVar2,&local_168);
    SmallVector<slang::parsing::Trivia,_8UL>::~SmallVector
              ((SmallVector<slang::parsing::Trivia,_8UL> *)local_108);
  }
  return;
}

Assistant:

void Preprocessor::MacroExpansion::append(Token token, SourceLocation location,
                                          bool allowLineContinuation) {
    if (!any) {
        if (!isTopLevel)
            token = token.withTrivia(alloc, usageSite.trivia());
        else
            token = token.withTrivia(alloc, {});
        any = true;
    }

    // Line continuations get stripped out when we expand macros and become newline trivia instead.
    if (token.kind == TokenKind::LineContinuation && !allowLineContinuation) {
        SmallVector<Trivia, 8> newTrivia;
        newTrivia.append(token.trivia());
        newTrivia.push_back(Trivia(TriviaKind::EndOfLine, token.rawText().substr(1)));

        dest.push_back(
            Token(alloc, TokenKind::EmptyMacroArgument, newTrivia.copy(alloc), "", location));
    }
    else {
        dest.push_back(token.withLocation(alloc, location));
    }
}